

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error FT_New_Face(FT_Library library,char *pathname,FT_Long face_index,FT_Face *aface)

{
  undefined1 local_70 [8];
  FT_Open_Args args;
  FT_Face *aface_local;
  FT_Long face_index_local;
  char *pathname_local;
  FT_Library library_local;
  
  if (pathname == (char *)0x0) {
    library_local._4_4_ = 6;
  }
  else {
    local_70._0_4_ = 4;
    args.pathname = (FT_String *)0x0;
    args.memory_size = (FT_Long)pathname;
    args.params = (FT_Parameter *)aface;
    library_local._4_4_ =
         ft_open_face_internal(library,(FT_Open_Args *)local_70,face_index,aface,'\x01');
  }
  return library_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_New_Face( FT_Library   library,
               const char*  pathname,
               FT_Long      face_index,
               FT_Face     *aface )
  {
    FT_Open_Args  args;


    /* test for valid `library' and `aface' delayed to `FT_Open_Face' */
    if ( !pathname )
      return FT_THROW( Invalid_Argument );

    args.flags    = FT_OPEN_PATHNAME;
    args.pathname = (char*)pathname;
    args.stream   = NULL;

    return ft_open_face_internal( library, &args, face_index, aface, 1 );
  }